

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::stringifyBinaryExpr<coro_io::execution_type,coro_io::execution_type>
          (String *__return_storage_ptr__,detail *this,execution_type *lhs,char *op,
          execution_type *rhs)

{
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toString<coro_io::execution_type,_true>(&local_48,(execution_type *)this);
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  toString<coro_io::execution_type,_true>(&SStack_78,(execution_type *)op);
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                                   const DOCTEST_REF_WRAP(R) rhs) {
            // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
            return toString(lhs) + op + toString(rhs);
        }